

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::pack_alpha_selectors
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  uint uVar3;
  unsigned_long_long *puVar4;
  unsigned_short *puVar5;
  vector<unsigned_char> *other;
  ulong local_168;
  uint64 i_2;
  uint64 prev_selector_1;
  uint64 selector_1;
  uint64 c_1;
  symbol_codec codec;
  static_huffman_data_model dm;
  uint64 i_1;
  uint64 prev_selector;
  uint64 selector;
  uint64 c;
  symbol_histogram hist;
  uint local_34;
  undefined1 local_30 [4];
  uint i;
  vector<unsigned_long_long> remapped_selectors;
  vector<unsigned_short> *remapping_local;
  vector<unsigned_char> *packed_data_local;
  crn_comp *this_local;
  
  remapped_selectors._8_8_ = remapping;
  uVar3 = vector<unsigned_long_long>::size(&this->m_alpha_selectors);
  vector<unsigned_long_long>::vector((vector<unsigned_long_long> *)local_30,uVar3);
  local_34 = 0;
  while( true ) {
    uVar3 = vector<unsigned_long_long>::size(&this->m_alpha_selectors);
    if (uVar3 <= local_34) break;
    puVar4 = vector<unsigned_long_long>::operator[](&this->m_alpha_selectors,local_34);
    uVar1 = *puVar4;
    puVar5 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)remapped_selectors._8_8_,local_34);
    puVar4 = vector<unsigned_long_long>::operator[]
                       ((vector<unsigned_long_long> *)local_30,(uint)*puVar5);
    *puVar4 = uVar1;
    local_34 = local_34 + 1;
  }
  symbol_histogram::symbol_histogram((symbol_histogram *)&c,0x40);
  i_1 = 0;
  dm.m_encoding = false;
  dm._49_7_ = 0;
  while( true ) {
    uVar3 = vector<unsigned_long_long>::size((vector<unsigned_long_long> *)local_30);
    if ((ulong)uVar3 <= (ulong)dm._48_8_) break;
    puVar4 = vector<unsigned_long_long>::operator[]
                       ((vector<unsigned_long_long> *)local_30,dm._48_4_);
    uVar2 = *puVar4;
    prev_selector = i_1 ^ uVar2;
    for (selector = 8; selector != 0; selector = selector - 1) {
      symbol_histogram::inc_freq((symbol_histogram *)&c,(uint)prev_selector & 0x3f,1);
      prev_selector = prev_selector >> 6;
    }
    dm._48_8_ = dm._48_8_ + 1;
    i_1 = uVar2;
  }
  static_huffman_data_model::static_huffman_data_model
            ((static_huffman_data_model *)&codec.m_support_arith);
  static_huffman_data_model::init
            ((static_huffman_data_model *)&codec.m_support_arith,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec((symbol_codec *)&c_1);
  symbol_codec::start_encoding((symbol_codec *)&c_1,0x100000);
  symbol_codec::encode_transmit_static_huffman_data_model
            ((symbol_codec *)&c_1,(static_huffman_data_model *)&codec.m_support_arith,false,
             (static_huffman_data_model *)0x0);
  i_2 = 0;
  local_168 = 0;
  while( true ) {
    uVar3 = vector<unsigned_long_long>::size((vector<unsigned_long_long> *)local_30);
    if (uVar3 <= local_168) break;
    puVar4 = vector<unsigned_long_long>::operator[]
                       ((vector<unsigned_long_long> *)local_30,(uint)local_168);
    uVar2 = *puVar4;
    prev_selector_1 = i_2 ^ uVar2;
    for (selector_1 = 8; selector_1 != 0; selector_1 = selector_1 - 1) {
      symbol_codec::encode
                ((symbol_codec *)&c_1,(uint)prev_selector_1 & 0x3f,
                 (static_huffman_data_model *)&codec.m_support_arith);
      prev_selector_1 = prev_selector_1 >> 6;
    }
    local_168 = local_168 + 1;
    i_2 = uVar2;
  }
  symbol_codec::stop_encoding((symbol_codec *)&c_1,false);
  other = symbol_codec::get_encoding_buf((symbol_codec *)&c_1);
  vector<unsigned_char>::swap(packed_data,other);
  symbol_codec::~symbol_codec((symbol_codec *)&c_1);
  static_huffman_data_model::~static_huffman_data_model
            ((static_huffman_data_model *)&codec.m_support_arith);
  symbol_histogram::~symbol_histogram((symbol_histogram *)&c);
  vector<unsigned_long_long>::~vector((vector<unsigned_long_long> *)local_30);
  return true;
}

Assistant:

bool crn_comp::pack_alpha_selectors(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint64> remapped_selectors(m_alpha_selectors.size());
        for (uint i = 0; i < m_alpha_selectors.size(); i++)
        {
            remapped_selectors[remapping[i]] = m_alpha_selectors[i];
        }
        symbol_histogram hist(64);
        for (uint64 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++)
        {
            for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 6)
            {
                hist.inc_freq(selector & 0x3F);
            }
        }
        static_huffman_data_model dm;
        dm.init(true, hist, 15);
        symbol_codec codec;
        codec.start_encoding(1024 * 1024);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        for (uint64 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++)
        {
            for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 6)
            {
                codec.encode(selector & 0x3F, dm);
            }
        }
        codec.stop_encoding(false);
        packed_data.swap(codec.get_encoding_buf());
        return true;
    }